

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_default_vfs_open_w
                    (ma_vfs *pVFS,wchar_t *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  ma_result mVar1;
  wchar_t *pwVar2;
  ma_allocation_callbacks *pAllocationCallbacks;
  wchar_t *pOpenMode;
  FILE *pFileStd;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pFile != (ma_vfs_file *)0x0) &&
     (*pFile = (ma_vfs_file)0x0, openMode != 0 && pFilePath != (wchar_t *)0x0)) {
    pwVar2 = L"r+";
    if ((openMode & 2) == 0) {
      pwVar2 = L"rb";
    }
    pOpenMode = L"wb";
    if ((openMode & 1) != 0) {
      pOpenMode = pwVar2;
    }
    pAllocationCallbacks = (ma_allocation_callbacks *)((long)pVFS + 0x40);
    if (pVFS == (ma_vfs *)0x0) {
      pAllocationCallbacks = (ma_allocation_callbacks *)0x0;
    }
    mVar1 = ma_wfopen(&pFileStd,pFilePath,pOpenMode,pAllocationCallbacks);
    if (mVar1 == MA_SUCCESS) {
      *pFile = pFileStd;
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_default_vfs_open_w(ma_vfs* pVFS, const wchar_t* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    if (pFile == NULL) {
        return MA_INVALID_ARGS;
    }

    *pFile = NULL;

    if (pFilePath == NULL || openMode == 0) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_open_w__win32(pVFS, pFilePath, openMode, pFile);
#else
    return ma_default_vfs_open_w__stdio(pVFS, pFilePath, openMode, pFile);
#endif
}